

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O3

sexp sexp_make_bytes_op(sexp ctx,sexp self,sexp_sint_t n,sexp len,sexp i)

{
  sexp psVar1;
  size_t __n;
  
  if (((ulong)len & 1) == 0) {
    psVar1 = sexp_type_exception(ctx,self,2,len);
    return psVar1;
  }
  __n = (long)len >> 1;
  if (-1 < (long)__n) {
    psVar1 = (sexp)sexp_alloc(ctx,__n + 0x11);
    if ((((ulong)psVar1 & 3) != 0) || (psVar1->tag != 0x13)) {
      psVar1->tag = 8;
      (psVar1->value).stack.length = __n;
      if (((ulong)i & 1) != 0) {
        memset((void *)((long)&psVar1->value + 8),(int)((ulong)i >> 1),__n);
      }
      (psVar1->value).flonum_bits[__n + 8] = '\0';
    }
    return psVar1;
  }
  psVar1 = sexp_xtype_exception(ctx,self,"negative length",len);
  return psVar1;
}

Assistant:

sexp sexp_make_bytes_op (sexp ctx, sexp self, sexp_sint_t n, sexp len, sexp i) {
  sexp_sint_t clen = sexp_unbox_fixnum(len);
  sexp s;
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, len);
  if (clen < 0) return sexp_xtype_exception(ctx, self, "negative length", len);
  s = sexp_alloc_atomic(ctx, sexp_sizeof(bytes)+clen+1);
  if (sexp_exceptionp(s)) return s;
  sexp_pointer_tag(s) = SEXP_BYTES;
#if SEXP_USE_HEADER_MAGIC
  sexp_pointer_magic(s) = SEXP_POINTER_MAGIC;
#endif
  sexp_bytes_length(s) = clen;
  if (sexp_fixnump(i))
    memset(sexp_bytes_data(s), sexp_unbox_fixnum(i), clen);
  sexp_bytes_data(s)[clen] = '\0';
  return s;
}